

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void diff(istream *oldStream,istream *newStream,ostream *outStream)

{
  pointer *this;
  uchar *source;
  size_type sourcesize;
  uchar *target;
  size_type targetsize;
  undefined1 auStack_118 [8];
  bsdiff_stream bsStream;
  OutZlibStream zlibStream;
  uint64_t newSize;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> newBuffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> oldBuffer;
  ostream *outStream_local;
  istream *newStream_local;
  istream *oldStream_local;
  
  load((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
       &newBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage,oldStream);
  load((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,newStream);
  zlibStream.m_outStream =
       (ostream *)
       std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::ostream::write((char *)outStream,(long)&zlibStream.m_outStream);
  OutZlibStream::OutZlibStream((OutZlibStream *)&bsStream.write,outStream);
  bsStream.opaque = malloc;
  bsStream.malloc = free;
  bsStream.free = write;
  auStack_118 = (undefined1  [8])&bsStream.write;
  this = &newBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  source = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  sourcesize = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  target = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  targetsize = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  bsdiff(source,sourcesize,target,targetsize,(bsdiff_stream *)auStack_118);
  OutZlibStream::~OutZlibStream((OutZlibStream *)&bsStream.write);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &newBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void diff(std::istream& oldStream, std::istream& newStream, std::ostream& outStream)
{
	// Load the old and new files in full
	auto oldBuffer = load(oldStream);
	auto newBuffer = load(newStream);

	// Write the size of the new file to the start of the output stream
	std::uint64_t newSize = newBuffer.size();
	outStream.write(reinterpret_cast<char*>(&newSize), sizeof(newSize));

	// Set up the zlib compression stream
	OutZlibStream zlibStream(outStream);

	// Create the diff
	bsdiff_stream bsStream{};
	bsStream.malloc = malloc;
	bsStream.free = free;
	bsStream.write = write;
	bsStream.opaque = &zlibStream;

	bsdiff(oldBuffer.data(), oldBuffer.size(), newBuffer.data(), newBuffer.size(), &bsStream);
}